

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_client::socket_t::
socket_t<asio::io_context::basic_executor_type<std::allocator<void>,0ul>&>
          (socket_t *this,basic_executor_type<std::allocator<void>,_0UL> *ioc)

{
  basic_executor_type<std::allocator<void>,_0UL> *in_RSI;
  any_io_executor *in_RDI;
  executor_type *in_stack_ffffffffffffff58;
  undefined1 __i;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff80;
  type_conflict1 tVar1;
  any_io_executor *this_00;
  allocator<char> local_5e;
  allocator<char> local_5d [13];
  basic_executor_type<std::allocator<void>,_0UL> local_50 [4];
  allocator<char> *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  basic_streambuf<std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  tVar1 = (type_conflict1)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_00 = in_RDI;
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::basic_executor_type
            (local_50,in_RSI);
  asio::any_io_executor::
  any_io_executor<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
            (this_00,(basic_executor_type<std::allocator<void>,_0UL> *)in_RDI,tVar1);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::basic_stream_socket
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __i = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  asio::any_io_executor::~any_io_executor((any_io_executor *)0x3d2c9e);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type(local_50);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff60,(bool)__i);
  *(undefined1 *)
   ((long)&this_00[1].
           super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
           .super_any_executor_base.target_ + 1) = 0;
  std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator(local_5d);
  std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator(&local_5e);
  return;
}

Assistant:

socket_t(ioc_t &&ioc) : impl_(std::forward<ioc_t>(ioc)) {}